

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O1

int __thiscall
CTcParser::load_object_file
          (CTcParser *this,CVmFile *fp,textchar_t *fname,tctarg_obj_id_t *obj_xlat,
          tctarg_prop_id_t *prop_xlat,ulong *enum_xlat)

{
  vm_obj_id_t vVar1;
  CTcSymbol *pCVar2;
  CTcParser *pCVar3;
  ulong *enum_xlat_00;
  int iVar4;
  CTcSymbol **ppCVar5;
  CTcDictEntry **ppCVar6;
  CTcSymObj *pCVar7;
  CTcPrsExport *exp;
  ulong uVar8;
  char b [4];
  uint local_44;
  CTcParser *local_40;
  ulong *local_38;
  
  local_38 = enum_xlat;
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  if ((ulong)local_44 != 0) {
    ppCVar5 = (CTcSymbol **)malloc((ulong)local_44 << 3);
    this->obj_sym_list_ = ppCVar5;
    this->obj_file_sym_idx_ = 0;
  }
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  if ((ulong)local_44 != 0) {
    ppCVar6 = (CTcDictEntry **)malloc((ulong)local_44 << 3);
    this->obj_dict_list_ = ppCVar6;
    this->obj_file_dict_idx_ = 0;
  }
  local_40 = this;
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  for (uVar8 = (ulong)local_44; uVar8 != 0; uVar8 = uVar8 - 1) {
    iVar4 = CTcSymbolBase::load_from_obj_file(fp,fname,obj_xlat,prop_xlat,local_38);
    if (iVar4 != 0) {
      return 1;
    }
  }
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  for (uVar8 = (ulong)local_44; uVar8 != 0; uVar8 = uVar8 - 1) {
    pCVar7 = CTcSymObjBase::load_from_obj_file_main(fp,fname,obj_xlat,(textchar_t *)0x0,0,1);
    if (pCVar7 == (CTcSymObj *)0x0) {
      return 1;
    }
  }
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  for (uVar8 = (ulong)local_44; uVar8 != 0; uVar8 = uVar8 - 1) {
    CVmFile::read_bytes(fp,(char *)&local_44,4);
    vVar1 = G_cg->next_obj_;
    G_cg->next_obj_ = vVar1 + 1;
    obj_xlat[local_44] = vVar1;
  }
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  pCVar3 = local_40;
  for (uVar8 = (ulong)local_44; uVar8 != 0; uVar8 = uVar8 - 1) {
    CVmFile::read_bytes(fp,(char *)&local_44,4);
    pCVar2 = pCVar3->obj_sym_list_[local_44 - 1];
    (*(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xb])
              (pCVar2,fp,fname,obj_xlat,prop_xlat);
  }
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  for (uVar8 = (ulong)local_44; uVar8 != 0; uVar8 = uVar8 - 1) {
    CVmFile::read_bytes(fp,(char *)&local_44,4);
    pCVar2 = pCVar3->obj_sym_list_[local_44 - 1];
    (*(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xb])
              (pCVar2,fp,fname,obj_xlat,prop_xlat);
  }
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  enum_xlat_00 = local_38;
  for (uVar8 = (ulong)local_44; uVar8 != 0; uVar8 = uVar8 - 1) {
    CTcGramProdEntry::load_from_obj_file(fp,prop_xlat,enum_xlat_00,(CTcSymObj *)0x0);
  }
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  pCVar3 = local_40;
  uVar8 = (ulong)local_44;
  if (uVar8 != 0) {
    do {
      CVmFile::read_bytes(fp,(char *)&local_44,4);
      pCVar7 = get_objfile_objsym(pCVar3,local_44);
      CTcGramProdEntry::load_from_obj_file(fp,prop_xlat,enum_xlat_00,pCVar7);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  CVmFile::read_bytes(fp,(char *)&local_44,4);
  uVar8 = (ulong)local_44;
  pCVar3 = local_40;
  while( true ) {
    local_40 = pCVar3;
    if (uVar8 == 0) {
      if (pCVar3->obj_sym_list_ != (CTcSymbol **)0x0) {
        free(pCVar3->obj_sym_list_);
        pCVar3->obj_sym_list_ = (CTcSymbol **)0x0;
      }
      if (pCVar3->obj_dict_list_ != (CTcDictEntry **)0x0) {
        free(pCVar3->obj_dict_list_);
        pCVar3->obj_dict_list_ = (CTcDictEntry **)0x0;
      }
      return 0;
    }
    exp = CTcPrsExport::read_from_obj_file(fp);
    if (exp == (CTcPrsExport *)0x0) break;
    add_export_to_list(local_40,exp);
    uVar8 = uVar8 - 1;
    pCVar3 = local_40;
  }
  return 1;
}

Assistant:

int CTcParser::load_object_file(class CVmFile *fp, const textchar_t *fname,
                                tctarg_obj_id_t *obj_xlat,
                                tctarg_prop_id_t *prop_xlat,
                                ulong *enum_xlat)
{
    ulong sym_cnt;
    ulong dict_cnt;
    ulong i;
    ulong anon_cnt;
    ulong nonsym_cnt;
    ulong prod_cnt;
    ulong exp_cnt;

    /* read the number of symbol index entries */
    sym_cnt = fp->read_uint4();
    if (sym_cnt != 0)
    {
        /* allocate space for the symbol index list */
        obj_sym_list_ = (CTcSymbol **)
                        t3malloc(sym_cnt * sizeof(obj_sym_list_[0]));

        /* the list is empty so far */
        obj_file_sym_idx_ = 0;
    }

    /* read the number of dictionary symbols */
    dict_cnt = fp->read_uint4();

    /* if there are any symbols, read them */
    if (dict_cnt != 0)
    {
        /* allocate space for the dictionary index list */
        obj_dict_list_ = (CTcDictEntry **)
                         t3malloc(dict_cnt * sizeof(obj_dict_list_[0]));

        /* nothing in the list yet */
        obj_file_dict_idx_ = 0;
    }

    /* read the number of symbols in the file */
    sym_cnt = fp->read_uint4();

    /* read the symbols */
    for (i = 0 ; i < sym_cnt ; ++i)
    {
        /* load a symbol */
        if (CTcSymbol::load_from_obj_file(fp, fname,
                                          obj_xlat, prop_xlat, enum_xlat))
            return 1;
    }

    /* read the number of anonymous object symbols */
    anon_cnt = fp->read_uint4();

    /* read the anonymous object symbols */
    for (i = 0 ; i < anon_cnt ; ++i)
    {
        /* load the next anonymous object symbol */
        if (CTcSymObj::load_from_obj_file(fp, fname, obj_xlat, TRUE))
            return 1;
    }

    /* read the non-symbol object ID's */
    nonsym_cnt = fp->read_uint4();
    for (i = 0 ; i < nonsym_cnt ; ++i)
    {
        tctarg_obj_id_t id;

        /* read the next non-symbol object ID */
        id = (tctarg_obj_id_t)fp->read_uint4();

        /* 
         *   allocate a new ID for the object, and set the translation
         *   table for the new ID - this will ensure that references to
         *   this non-symbol object are properly fixed up 
         */
        obj_xlat[id] = G_cg->new_obj_id();
    }

    /* read the number of symbol cross-reference sections in the file */
    sym_cnt = fp->read_uint4();

    /* read the symbol cross-references */
    for (i = 0 ; i < sym_cnt ; ++i)
    {
        ulong idx;
        CTcSymbol *sym;

        /* read the symbol index */
        idx = fp->read_uint4();

        /* get the symbol from the index list */
        sym = get_objfile_sym(idx);

        /* load the symbol's reference information */
        sym->load_refs_from_obj_file(fp, fname, obj_xlat, prop_xlat);
    }

    /* read the number of anonymous object cross-references */
    anon_cnt = fp->read_uint4();

    /* read the anonymous object cross-references */
    for (i = 0 ; i < anon_cnt ; ++i)
    {
        ulong idx;
        CTcSymbol *sym;

        /* read the symbol index */
        idx = fp->read_uint4();

        /* get the symbol from the index list */
        sym = get_objfile_sym(idx);

        /* load the symbol's reference information */
        sym->load_refs_from_obj_file(fp, fname, obj_xlat, prop_xlat);
    }

    /* read the master grammar rule count */
    prod_cnt = fp->read_uint4();

    /* read the master grammar rule list */
    for (i = 0 ; i < prod_cnt ; ++i)
    {
        /* read the next grammar production */
        CTcGramProdEntry::load_from_obj_file(fp, prop_xlat, enum_xlat, 0);
    }

    /* read the number of named grammar rules */
    prod_cnt = fp->read_uint4();

    /* read the private grammar rules */
    for (i = 0 ; i < prod_cnt ; ++i)
    {
        CTcSymObj *match_sym;

        /* read the match object defining the rule */
        match_sym = get_objfile_objsym(fp->read_uint4());

        /* read the private rule list */
        CTcGramProdEntry::load_from_obj_file(
            fp, prop_xlat, enum_xlat, match_sym);
    }

    /* read the export symbol list */
    exp_cnt = fp->read_uint4();
    for (i = 0 ; i < exp_cnt ; ++i)
    {
        CTcPrsExport *exp;
        
        /* read the next entry */
        exp = CTcPrsExport::read_from_obj_file(fp);

        /* if that failed, the whole load fails */
        if (exp == 0)
            return 1;

        /* add it to our list */
        add_export_to_list(exp);
    }

    /* done with the symbol index list - free it */
    if (obj_sym_list_ != 0)
    {
        /* free it and forget it */
        t3free(obj_sym_list_);
        obj_sym_list_ = 0;
    }

    /* done with the dictionary index list - free it */
    if (obj_dict_list_ != 0)
    {
        /* free the memory and forget it */
        t3free(obj_dict_list_);
        obj_dict_list_ = 0;
    }

    /* success */
    return 0;
}